

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O2

int __thiscall
CVmObjLookupTable::getp_key_present
          (CVmObjLookupTable *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  vm_lookup_val *pvVar2;
  undefined4 in_register_00000034;
  vm_val_t key;
  
  if (getp_key_present(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar1 = __cxa_guard_acquire(&getp_key_present(unsigned_int,vm_val_t*,unsigned_int*)::desc,
                                CONCAT44(in_register_00000034,self));
    if (iVar1 != 0) {
      getp_key_present::desc.min_argc_ = 1;
      getp_key_present::desc.opt_argc_ = 0;
      getp_key_present::desc.varargs_ = 0;
      __cxa_guard_release(&getp_key_present(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    }
  }
  iVar1 = CVmObject::get_prop_check_argc(retval,argc,&getp_key_present::desc);
  if (iVar1 == 0) {
    key.typ = sp_[-1].typ;
    key._4_4_ = *(undefined4 *)&sp_[-1].field_0x4;
    key.val = sp_[-1].val;
    sp_ = sp_ + -1;
    pvVar2 = find_entry(this,&key,(uint *)0x0,(vm_lookup_val **)0x0);
    retval->typ = VM_TRUE - (pvVar2 == (vm_lookup_val *)0x0);
  }
  return 1;
}

Assistant:

int CVmObjLookupTable::getp_key_present(VMG_ vm_obj_id_t self,
                                        vm_val_t *retval, uint *argc)
{
    vm_lookup_val *entry;
    vm_val_t key;
    static CVmNativeCodeDesc desc(1);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the key */
    G_stk->pop(&key);
    
    /* find the entry for this key */
    entry = find_entry(vmg_ &key, 0, 0);

    /* return true if we found it, nil if not */
    retval->set_logical(entry != 0);

    /* handled */
    return TRUE;
}